

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_rel_exp(SyntaxAnalyze *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pWVar1;
  int *piVar2;
  SyntaxAnalyze *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  ExpressNode *this_01;
  ulong uVar7;
  uint uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SyntaxAnalyze *in_RSI;
  Op op;
  SharedExNdPtr SVar9;
  SharedExNdPtr father;
  string tmpName;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  SyntaxAnalyze *local_f0;
  undefined1 local_e8 [40];
  SharedExNdPtr local_c0;
  SharedExNdPtr local_b0;
  SharedExNdPtr local_a0;
  SharedExNdPtr local_90;
  string local_80;
  irGenerator *local_60;
  size_t *local_58;
  string local_50;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  local_f0 = this;
  gm_exp((SyntaxAnalyze *)local_e8);
  uVar5 = local_e8._8_8_;
  uVar4 = local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
  *(undefined8 *)this = uVar4;
  this->matched_index = uVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  local_58 = &local_f0->matched_index;
  local_60 = &in_RSI->irGenerator;
  do {
    bVar6 = try_word(in_RSI,1,LSS,GRE);
    if ((!bVar6) && (bVar6 = try_word(in_RSI,1,LEQ,GEQ), !bVar6)) {
      SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_f0;
      return (SharedExNdPtr)
             SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_01 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
              (&local_f8,this_01);
    uVar7 = in_RSI->matched_index + 1;
    pWVar1 = (in_RSI->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar7 < (ulong)(((long)(in_RSI->word_list->
                                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                        -0x5555555555555555)) &&
       (bVar6 = word::Word::match_token(pWVar1 + uVar7,LSS), bVar6)) {
      this_01->_operation = LSS;
      op = Lt;
      match_one_word(in_RSI,LSS);
    }
    else {
      uVar7 = in_RSI->matched_index + 1;
      pWVar1 = (in_RSI->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((uVar7 < (ulong)(((long)(in_RSI->word_list->
                                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                          -0x5555555555555555)) &&
         (bVar6 = word::Word::match_token(pWVar1 + uVar7,GRE), bVar6)) {
        this_01->_operation = GRE;
        op = Gt;
        match_one_word(in_RSI,GRE);
      }
      else {
        uVar7 = in_RSI->matched_index + 1;
        pWVar1 = (in_RSI->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((uVar7 < (ulong)(((long)(in_RSI->word_list->
                                    super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4)
                            * -0x5555555555555555)) &&
           (bVar6 = word::Word::match_token(pWVar1 + uVar7,LEQ), bVar6)) {
          this_01->_operation = LEQ;
          op = Lte;
          match_one_word(in_RSI,LEQ);
        }
        else {
          this_01->_operation = GEQ;
          op = Gte;
          match_one_word(in_RSI,GEQ);
        }
      }
    }
    pSVar3 = local_f0;
    gm_exp((SyntaxAnalyze *)local_e8);
    uVar5 = local_e8._8_8_;
    uVar4 = local_e8._0_8_;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e8._0_8_ = (element_type *)0x0;
    piVar2 = *(int **)pSVar3;
    if ((*piVar2 == 0) &&
       (*(int *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)uVar4)->_M_ptr
        == 0)) {
      this_01->_type = CNS;
      switch(this_01->_operation) {
      case LSS:
        uVar8 = (uint)(piVar2[2] <
                      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar4 + 8))->_M_pi);
        break;
      case LEQ:
        uVar8 = (uint)(piVar2[2] <=
                      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar4 + 8))->_M_pi);
        break;
      case GEQ:
        uVar8 = (uint)(*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar4 + 8))->_M_pi
                      <= piVar2[2]);
        break;
      case GRE:
        uVar8 = (uint)(*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar4 + 8))->_M_pi <
                      piVar2[2]);
        break;
      default:
        goto switchD_001ad7fa_default;
      }
      this_01->_value = uVar8;
    }
    else {
      local_e8._0_8_ = local_e8 + 0x10;
      local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8[0x10] = 0;
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_50,local_60,Int);
      std::__cxx11::string::operator=((string *)local_e8,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)(local_50.field_2._M_allocated_capacity + 1));
      }
      this_01->_type = VAR;
      std::__cxx11::string::_M_assign((string *)&this_01->_name);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_e8._0_8_,
                 (undefined1 *)
                 ((long)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                         local_e8._0_8_)->_M_ptr + (long)(_func_int ***)local_e8._8_8_));
      local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)pSVar3;
      local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar3->matched_index;
      if (local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar4;
      local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
        }
      }
      hp_gn_binary_mir(in_RSI,&local_80,&local_90,&local_a0,op);
      if (local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        (ulong)(local_80.field_2._M_allocated_capacity + 1));
      }
      if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
      }
    }
switchD_001ad7fa_default:
    local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)pSVar3;
    local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar3->matched_index;
    if (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    express::ExpressNode::addChild(this_01,&local_b0);
    if (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar4;
    local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
      }
    }
    express::ExpressNode::addChild(this_01,&local_c0);
    if (local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    *(ExpressNode **)local_f0 = this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_58,&local_f8);
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
    }
  } while( true );
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_rel_exp() {
  SharedExNdPtr first;
  first = gm_exp();

  while (try_word(1, Token::LSS, Token::GRE) ||
         try_word(1, Token::LEQ, Token::GEQ)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::LSS)) {
      father->_operation = OperationType::LSS;
      match_one_word(Token::LSS);
      op = Op::Lt;
    } else if (try_word(1, Token::GRE)) {
      father->_operation = OperationType::GRE;
      match_one_word(Token::GRE);
      op = Op::Gt;
    } else if (try_word(1, Token::LEQ)) {
      father->_operation = OperationType::LEQ;
      match_one_word(Token::LEQ);
      op = Op::Lte;
    } else {
      father->_operation = OperationType::GEQ;
      match_one_word(Token::GEQ);
      op = Op::Gte;
    }

    second = gm_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::LSS:
          father->_value = first->_value < second->_value;
          break;
        case OperationType::LEQ:
          father->_value = first->_value <= second->_value;
          break;
        case OperationType::GRE:
          father->_value = first->_value > second->_value;
          break;
        case OperationType::GEQ:
          father->_value = first->_value >= second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }

    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}